

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwVerify(int exp,char *exps,char *fn,int ln)

{
  int iVar1;
  char *format;
  char buffer [2056];
  char acStack_838 [2064];
  
  iVar1 = 0;
  if (exp == 0) {
    if (mwInited == 0) {
      mwUseAtexit = 1;
      mwInit();
    }
    if (mwTestAlways != 0) {
      mwTestNow(fn,ln,1);
    }
    mwErrors = mwErrors + 1;
    iVar1 = mwFlushR();
    mwFlushingB2 = iVar1 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
    mwCounter = mwCounter + 1;
    mwWrite("verify trap: <%ld> %s(%d), %s\n",mwCounter,fn,(ulong)(uint)ln,exps);
    if (mwAriFunction == (_func_int_char_ptr *)0x0) {
      if (((byte)mwAriAction & 0x10) != 0) {
        mwFlush();
      }
      if (((byte)mwAriAction & 1) == 0) {
        fprintf(_stderr,"\nMEMWATCH: verify trap: %s(%d), %s\n",fn,(ulong)(uint)ln,exps);
LAB_001085e9:
        mwFlush();
        mwTestNow(fn,ln,1);
        mwFlush();
        exit(0xff);
      }
      iVar1 = 0;
      format = "verify trap: <%ld> AUTO IGNORED - execution continues\n";
    }
    else {
      sprintf(acStack_838,"MEMWATCH: verify trap: %s(%d), %s",fn,(ulong)(uint)ln,exps);
      iVar1 = (*mwAriFunction)(acStack_838);
      if (iVar1 == 0) {
        format = "verify trap: <%ld> IGNORED - execution continues\n";
      }
      else {
        if (iVar1 != 1) goto LAB_001085e9;
        format = "verify trap: <%ld> RETRY - executing again\n";
      }
    }
    mwWrite(format,mwCounter);
  }
  return iVar1;
}

Assistant:

int mwVerify(int exp, const char *exps, const char *fn, int ln)
{
	int i;
	char buffer[MW_TRACE_BUFFER + 8];
	if (exp) {
		return 0;
	}
	mwAutoInit();
	MW_MUTEX_LOCK();
	TESTS(fn, ln);
	mwIncErr();
	mwCounter++;
	mwWrite("verify trap: <%ld> %s(%d), %s\n", mwCounter, fn, ln, exps);
	if (mwAriFunction != NULL) {
		sprintf(buffer, "MEMWATCH: verify trap: %s(%d), %s", fn, ln, exps);
		i = (*mwAriFunction)(buffer);
		if (i == 0) {
			mwWrite("verify trap: <%ld> IGNORED - execution continues\n", mwCounter);
			MW_MUTEX_UNLOCK();
			return 0;
		}
		if (i == 1) {
			mwWrite("verify trap: <%ld> RETRY - executing again\n", mwCounter);
			MW_MUTEX_UNLOCK();
			return 1;
		}
	} else {
		if (mwAriAction & MW_ARI_NULLREAD) {
			/* This is made in an attempt to kick in */
			/* any debuggers or OS stack traces */
			FLUSH();
			/*lint -save -e413 */
			i = *((int *)NULL);
			mwDummy((char)i);
			/*lint -restore */
		}
		if (mwAriAction & MW_ARI_IGNORE) {
			mwWrite("verify trap: <%ld> AUTO IGNORED - execution continues\n", mwCounter);
			MW_MUTEX_UNLOCK();
			return 0;
		}
		fprintf(mwSTDERR, "\nMEMWATCH: verify trap: %s(%d), %s\n", fn, ln, exps);
	}
	FLUSH();
	(void) mwTestNow(fn, ln, 1);
	FLUSH();
	MW_MUTEX_UNLOCK();
	exit(255);
	/* NOT REACHED - the return statement is in to keep */
	/* stupid compilers from squeaking about differing return modes. */
	/* Smart compilers instead say 'code unreachable...' */
	/*lint -save -e527 */
	return 0;
	/*lint -restore */
}